

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontConfig::ImFontConfig(ImFontConfig *this)

{
  undefined8 *in_RDI;
  ImVec2 local_18;
  ImVec2 local_10 [2];
  
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 0x24));
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 0x2c));
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 0xc) = 1;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  *(undefined4 *)(in_RDI + 3) = 3;
  *(undefined4 *)((long)in_RDI + 0x1c) = 1;
  *(undefined1 *)(in_RDI + 4) = 0;
  ImVec2::ImVec2(local_10,0.0,0.0);
  *(ImVec2 *)((long)in_RDI + 0x24) = local_10[0];
  ImVec2::ImVec2(&local_18,0.0,0.0);
  *(ImVec2 *)((long)in_RDI + 0x2c) = local_18;
  in_RDI[7] = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x44) = 0x7f7fffff;
  *(undefined1 *)(in_RDI + 9) = 0;
  *(undefined4 *)((long)in_RDI + 0x4c) = 0;
  *(undefined4 *)(in_RDI + 10) = 0x3f800000;
  *(undefined2 *)((long)in_RDI + 0x54) = 0xffff;
  memset((void *)((long)in_RDI + 0x56),0,0x28);
  in_RDI[0x10] = 0;
  return;
}

Assistant:

ImFontConfig::ImFontConfig()
{
    FontData = NULL;
    FontDataSize = 0;
    FontDataOwnedByAtlas = true;
    FontNo = 0;
    SizePixels = 0.0f;
    OversampleH = 3; // FIXME: 2 may be a better default?
    OversampleV = 1;
    PixelSnapH = false;
    GlyphExtraSpacing = ImVec2(0.0f, 0.0f);
    GlyphOffset = ImVec2(0.0f, 0.0f);
    GlyphRanges = NULL;
    GlyphMinAdvanceX = 0.0f;
    GlyphMaxAdvanceX = FLT_MAX;
    MergeMode = false;
    RasterizerFlags = 0x00;
    RasterizerMultiply = 1.0f;
    EllipsisChar = (ImWchar)-1;
    memset(Name, 0, sizeof(Name));
    DstFont = NULL;
}